

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O0

void __thiscall cmParseCacheCoverage::RemoveUnCoveredFiles(cmParseCacheCoverage *this)

{
  cmCTest *this_00;
  cmCTestCoverageHandlerContainer *pcVar1;
  bool bVar2;
  bool bVar3;
  pointer ppVar4;
  reference piVar5;
  ostream *poVar6;
  char *msg;
  _Self __position;
  string local_1f8 [48];
  ostringstream local_1c8 [8];
  ostringstream cmCTestLog_msg;
  iterator iStack_48;
  int i;
  iterator __end2;
  iterator __begin2;
  SingleFileCoverageVector *__range2;
  bool nothing;
  SingleFileCoverageVector *v;
  _Self local_18;
  iterator ci;
  cmParseCacheCoverage *this_local;
  
  ci._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::begin(&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage);
  do {
    v = (SingleFileCoverageVector *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::end(&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage);
    bVar2 = std::operator!=(&local_18,(_Self *)&v);
    if (!bVar2) {
      return;
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator->(&local_18);
    bVar2 = true;
    __end2 = std::vector<int,_std::allocator<int>_>::begin(&ppVar4->second);
    iStack_48 = std::vector<int,_std::allocator<int>_>::end(&ppVar4->second);
    while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar3) {
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      if (0 < *piVar5) {
        bVar2 = false;
        break;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar6 = std::operator<<((ostream *)local_1c8,"No coverage found in: ");
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_18);
      poVar6 = std::operator<<(poVar6,(string *)ppVar4);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this_00 = (this->super_cmParseMumpsCoverage).CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_00,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                   ,0x41,msg,(bool)(((this->super_cmParseMumpsCoverage).Coverage)->Quiet & 1));
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
      pcVar1 = (this->super_cmParseMumpsCoverage).Coverage;
      __position = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator++(&local_18,0);
      std::
      map<std::__cxx11::string,std::vector<int,std::allocator<int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
      ::erase_abi_cxx11_((map<std::__cxx11::string,std::vector<int,std::allocator<int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                          *)&pcVar1->TotalCoverage,(iterator)__position._M_node);
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&local_18);
    }
  } while( true );
}

Assistant:

void cmParseCacheCoverage::RemoveUnCoveredFiles()
{
  // loop over the coverage data computed and remove all files
  // that only have -1 or 0 for the lines.
  cmCTestCoverageHandlerContainer::TotalCoverageMap::iterator ci =
    this->Coverage.TotalCoverage.begin();
  while (ci != this->Coverage.TotalCoverage.end()) {
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector& v = ci->second;
    bool nothing = true;
    for (int i : v) {
      if (i > 0) {
        nothing = false;
        break;
      }
    }
    if (nothing) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "No coverage found in: " << ci->first << std::endl,
                         this->Coverage.Quiet);
      this->Coverage.TotalCoverage.erase(ci++);
    } else {
      ++ci;
    }
  }
}